

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

int If_CutCountTotalFanins(If_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  Vec_Int_t *vLeaves;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  timespec ts;
  long local_48;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    local_48 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 100;
  piVar3 = (int *)malloc(400);
  vLeaves->pArray = piVar3;
  pVVar4 = p->vObjs;
  if (pVVar4->nSize < 1) {
    uVar7 = 0;
    uVar6 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    do {
      puVar1 = (uint *)pVVar4->pArray[lVar5];
      if (((*puVar1 & 0xf) == 4) && (puVar1[3] != 0)) {
        uVar7 = uVar7 + *(byte *)((long)puVar1 + 0x6f);
        vLeaves->nSize = 0;
        If_CutFoundFanins_rec(*(If_Obj_t **)(puVar1 + 6),vLeaves);
        If_CutFoundFanins_rec(*(If_Obj_t **)(puVar1 + 8),vLeaves);
        uVar6 = uVar6 + vLeaves->nSize;
        pVVar4 = p->vObjs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar4->nSize);
  }
  Abc_Print(1,"Total cut inputs = %d. Total fanins incremental = %d.\n",(ulong)uVar7,(ulong)uVar6);
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(1,"%s =","Fanins");
  Abc_Print(1,"%9.2f sec\n",(double)(lVar5 + local_48) / 1000000.0);
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  return 1;
}

Assistant:

int If_CutCountTotalFanins( If_Man_t * p )
{
    If_Obj_t * pObj;
    Vec_Int_t * vLeaves;
    int i, nFaninsTotal = 0, Counter = 0;
    abctime clk = Abc_Clock();
    vLeaves = Vec_IntAlloc( 100 );
    If_ManForEachObj( p, pObj, i )
    {
        if ( If_ObjIsAnd(pObj) && pObj->nRefs )
        {
            nFaninsTotal += If_ObjCutBest(pObj)->nLeaves;
            Vec_IntClear( vLeaves );
            If_CutFoundFanins_rec( If_ObjFanin0(pObj), vLeaves );
            If_CutFoundFanins_rec( If_ObjFanin1(pObj), vLeaves );
            Counter += Vec_IntSize(vLeaves);
        }
    }
    Abc_Print( 1, "Total cut inputs = %d. Total fanins incremental = %d.\n", nFaninsTotal, Counter );
    Abc_PrintTime( 1, "Fanins", Abc_Clock() - clk );
    Vec_IntFree( vLeaves );
    return 1;
}